

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_template.c
# Opt level: O2

int plot_click(t_gobj *z,_glist *glist,t_word *data,t_template *template,t_scalar *sc,_array *ap,
              t_float basex,t_float basey,int xpix,int ypix,int shift,int alt,int dbl,int doit)

{
  t_gobj *ptVar1;
  _glist *p_Var2;
  int iVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  _instancecanvas *p_Var7;
  _instancetemplate *p_Var8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  long lVar13;
  long lVar14;
  char *pcVar15;
  float fVar16;
  float fVar17;
  t_float tVar18;
  float fVar19;
  t_float tVar20;
  float fVar21;
  float fVar25;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  float fVar26;
  float fVar27;
  undefined4 in_XMM5_Db;
  t_float pwpix;
  _glist *local_150;
  long local_148;
  ulong local_140;
  _array *local_138;
  _fielddesc *local_130;
  ulong local_128;
  double local_120;
  t_template *local_118;
  _fielddesc *local_110;
  undefined8 local_108;
  undefined8 uStack_100;
  long local_f8;
  _fielddesc *local_f0;
  t_float pypix;
  undefined4 uStack_e4;
  t_float pxpix;
  undefined8 local_d8;
  float fStack_d0;
  float fStack_cc;
  t_float edit;
  t_float scalarvis;
  t_float vis;
  t_float yloc;
  t_float xinc;
  t_float xloc;
  int xonset;
  int wonset;
  int yonset;
  int elemsize;
  uint local_a0;
  int yonset_1;
  undefined8 local_98;
  t_symbol *local_80;
  _fielddesc *wfielddesc;
  _fielddesc *yfielddesc;
  _fielddesc *xfielddesc;
  _array *array;
  t_symbol *elemtemplatesym;
  t_template *elemtemplate;
  t_float style;
  t_float linewidth;
  int wonset_1;
  _glist *elemtemplatecanvas;
  undefined8 uVar22;
  
  local_150 = glist;
  local_138 = ap;
  local_108 = sc;
  iVar3 = plot_readownertemplate
                    ((t_plot *)z,data,template,&elemtemplatesym,&array,&linewidth,&xloc,&xinc,&yloc,
                     &style,&vis,&scalarvis,&edit,&xfielddesc,&yfielddesc,&wfielddesc);
  if ((iVar3 == 0) && ((vis != 0.0 || (NAN(vis))))) {
    fVar16 = basex + xloc;
    local_128 = CONCAT44(local_128._4_4_,xinc);
    fVar17 = basey + yloc;
    local_140 = CONCAT44(local_140._4_4_,scalarvis);
    local_d8 = (double)CONCAT44(local_d8._4_4_,edit);
    iVar3 = array_getfields(elemtemplatesym,&elemtemplatecanvas,&elemtemplate,&elemsize,xfielddesc,
                            yfielddesc,wfielddesc,&xonset,&yonset,&wonset);
    p_Var2 = local_150;
    if (iVar3 == 0) {
      local_80 = elemtemplatesym;
      local_f0 = xfielddesc;
      local_130 = yfielddesc;
      uVar4 = (uint)array->a_n / 1000;
      if (array->a_n < 0x7d1) {
        uVar4 = 1;
      }
      local_120 = (double)CONCAT44(local_120._4_4_,uVar4);
      p_Var8 = (pd_maininstance.pd_gui)->i_template;
      local_148 = CONCAT44(local_148._4_4_,elemsize);
      *(int *)(p_Var8 + 0xa4) = elemsize;
      *(_glist **)(p_Var8 + 0x78) = local_150;
      *(t_scalar **)(p_Var8 + 0x80) = local_108;
      *(_array **)(p_Var8 + 0x88) = local_138;
      *(t_template **)(p_Var8 + 0x98) = elemtemplate;
      tVar18 = glist_dpixtodx(local_150,1.0);
      *(t_float *)((pd_maininstance.pd_gui)->i_template + 0xb0) = tVar18;
      tVar18 = glist_dpixtody(p_Var2,1.0);
      *(t_float *)((pd_maininstance.pd_gui)->i_template + 0xb4) = tVar18;
      ptVar1 = p_Var2->gl_list;
      if (((ptVar1 != (t_gobj *)0x0) && (ptVar1->g_pd == garray_class)) &&
         ((int)local_148 == 8 && ptVar1->g_next == (_gobj *)0x0)) {
        tVar18 = glist_pixelstox(local_150,(float)xpix);
        p_Var2 = local_150;
        iVar5 = (int)tVar18;
        iVar3 = 0;
        if ((-1 < iVar5) && (iVar3 = array->a_n + -1, iVar5 < array->a_n)) {
          iVar3 = iVar5;
        }
        *(_fielddesc **)((pd_maininstance.pd_gui)->i_template + 0x70) = local_130;
        tVar18 = glist_pixelstoy(local_150,(float)ypix);
        p_Var8 = (pd_maininstance.pd_gui)->i_template;
        *(t_float *)(p_Var8 + 100) = tVar18;
        *(undefined4 *)(p_Var8 + 0xbc) = 0;
        *(undefined8 *)(p_Var8 + 0x68) = 0;
        *(undefined4 *)(p_Var8 + 0x60) = 0;
        *(float *)(p_Var8 + 0xac) = (float)iVar3;
        *(int *)(p_Var8 + 0xb8) = (int)(float)iVar3;
        *(int *)(p_Var8 + 0xa0) = array->a_n;
        pcVar15 = array->a_vec;
        *(char **)(p_Var8 + 0x90) = pcVar15;
        if (doit == 0) {
          return 0;
        }
        tVar18 = glist_pixelstoy(p_Var2,(float)ypix);
        fielddesc_setcoord(local_130,elemtemplate,(t_word *)(pcVar15 + (iVar3 << 3)),tVar18,1);
        glist_grab(p_Var2,(t_gobj *)0x0,array_motionfn,(t_glistkeyfn)0x0,xpix,ypix);
        p_Var8 = (pd_maininstance.pd_gui)->i_template;
        if (*(t_scalar **)(p_Var8 + 0x80) != (t_scalar *)0x0) {
          scalar_redraw(*(t_scalar **)(p_Var8 + 0x80),*(_glist **)(p_Var8 + 0x78));
          p_Var8 = (pd_maininstance.pd_gui)->i_template;
        }
        if (*(_array **)(p_Var8 + 0x88) == (_array *)0x0) {
          return 0;
        }
        array_redraw(*(_array **)(p_Var8 + 0x88),*(_glist **)(p_Var8 + 0x78));
        return 0;
      }
      local_110 = wfielddesc;
      lVar14 = (long)(int)local_148;
      local_f8 = CONCAT44(local_f8._4_4_,xonset);
      local_118 = (t_template *)CONCAT44(local_118._4_4_,(float)xpix);
      local_138 = (_array *)CONCAT44(local_138._4_4_,yonset);
      uVar10 = (ulong)local_120 & 0xffffffff;
      local_108 = (t_scalar *)0x42c80000;
      uStack_100 = 0;
      lVar9 = 0;
      local_98 = (double)CONCAT44(in_XMM5_Db,(float)ypix);
      fStack_d0 = (float)ypix;
      for (lVar13 = 0; uVar6 = (ulong)array->a_n, lVar13 < (long)uVar6; lVar13 = lVar13 + uVar10) {
        array_getcoordinate(local_150,array->a_vec + lVar9,(int)local_f8,(int)local_138._0_4_,wonset
                            ,(int)lVar13,fVar16,fVar17,(t_float)local_128,local_f0,local_130,
                            local_110,&pxpix,&pypix,&pwpix);
        fVar21 = pxpix - local_118._0_4_;
        fVar19 = -fVar21;
        if (-fVar21 <= fVar21) {
          fVar19 = fVar21;
        }
        if (fVar19 <= 8.0) {
          fVar26 = pypix - (float)local_98;
          fVar21 = -fVar26;
          if (-fVar26 <= fVar26) {
            fVar21 = fVar26;
          }
          fVar26 = fVar21 + fVar19;
          if ((float)local_108 <= fVar21 + fVar19) {
            fVar26 = (float)local_108;
          }
          if (wonset < 0) {
            local_108 = (t_scalar *)CONCAT44(0x80000000,fVar26);
            uStack_100 = 0x8000000080000000;
          }
          else {
            fVar21 = 4.0;
            if (4.0 <= pwpix) {
              fVar21 = pwpix;
            }
            fVar27 = (fVar21 + pypix) - (float)local_98;
            fVar25 = -fVar27;
            if (-fVar27 <= fVar27) {
              fVar25 = fVar27;
            }
            fVar27 = fVar25 + fVar19;
            if (fVar26 <= fVar25 + fVar19) {
              fVar27 = fVar26;
            }
            fVar26 = (pypix - fVar21) - (float)local_98;
            fVar21 = -fVar26;
            if (-fVar26 <= fVar26) {
              fVar21 = fVar26;
            }
            local_108 = (t_scalar *)CONCAT44(0x80000000,fVar27);
            uStack_100 = 0x8000000080000000;
            if (fVar21 + fVar19 < fVar27) {
              local_108 = (t_scalar *)CONCAT44(0x80000000,fVar21 + fVar19);
              uStack_100 = 0x8000000080000000;
            }
          }
        }
        lVar9 = lVar9 + lVar14 * uVar10;
        fStack_d0 = (float)local_98;
      }
      if ((float)local_108 <= 8.0) {
        if (((float)local_d8 != 0.0) || (NAN((float)local_d8))) {
          local_120 = (double)CONCAT44(local_120._4_4_,local_120._0_4_ * (int)local_148);
          lVar9 = 0;
          local_140 = CONCAT44(local_140._4_4_,(float)local_108 + 0.001);
          iVar3 = (int)local_148;
          fStack_cc = fStack_d0;
          local_d8._0_4_ = fStack_d0;
          local_d8._4_4_ = fStack_d0;
          for (uVar12 = 0; (long)uVar12 < (long)(int)uVar6; uVar12 = uVar12 + uVar10) {
            local_108 = (t_scalar *)CONCAT44(local_108._4_4_,iVar3);
            uVar4 = (uint)uVar12;
            array_getcoordinate(local_150,array->a_vec + lVar9,(int)local_f8,(int)local_138._0_4_,
                                wonset,uVar4,fVar16,fVar17,(t_float)local_128,local_f0,local_130,
                                local_110,&pxpix,&pypix,&pwpix);
            p_Var7 = pd_maininstance.pd_gui;
            if (pwpix < 4.0) {
              pwpix = 4.0;
            }
            fVar21 = pypix - (float)local_98;
            fVar19 = -fVar21;
            if (-fVar21 <= fVar21) {
              fVar19 = fVar21;
            }
            if (wonset < 0) {
              uVar22 = 0x42c8000042c80000;
            }
            else {
              fVar21 = (pwpix + pypix) - (float)local_d8;
              fVar26 = (pypix - pwpix) - local_d8._4_4_;
              auVar23._0_8_ = CONCAT44(fVar26,fVar21) ^ 0x8000000080000000;
              auVar23._8_4_ = -(0.0 - fStack_d0);
              auVar23._12_4_ = -(0.0 - fStack_cc);
              auVar24._4_4_ = fVar26;
              auVar24._0_4_ = fVar21;
              auVar24._8_4_ = 0.0 - fStack_d0;
              auVar24._12_4_ = 0.0 - fStack_cc;
              auVar24 = maxps(auVar23,auVar24);
              uVar22 = auVar24._0_8_;
              if ((int)local_138._0_4_ < 0) {
                fVar19 = 100.0;
              }
            }
            fVar26 = pxpix - local_118._0_4_;
            fVar21 = -fVar26;
            if (-fVar26 <= fVar26) {
              fVar21 = fVar26;
            }
            fVar26 = (float)uVar22;
            fVar25 = (float)((ulong)uVar22 >> 0x20);
            iVar3 = (int)(float)local_108;
            if (((fVar21 + fVar19 <= (float)local_140) || (fVar21 + fVar26 <= (float)local_140)) ||
               (fVar21 + fVar25 <= (float)local_140)) {
              if ((fVar26 <= fVar19) || (fVar25 <= fVar19)) {
                if (fVar25 <= fVar26) {
                  *(undefined4 *)((pd_maininstance.pd_gui)->i_template + 0xbc) = 1;
                }
                else {
                  *(undefined4 *)((pd_maininstance.pd_gui)->i_template + 0xbc) = 0xffffffff;
                }
              }
              else {
                *(undefined4 *)((pd_maininstance.pd_gui)->i_template + 0xbc) = 0;
              }
              if (doit != 0) {
                pcVar15 = array->a_vec;
                if ((alt != 0) && (local_118._0_4_ < pxpix)) {
                  if (array->a_n < 2) {
                    return 0;
                  }
                  memmove(pcVar15 + lVar9,pcVar15 + (int)(float)local_108,
                          (long)(int)((~uVar4 + array->a_n) * (int)local_148));
                  array_resize_and_redraw(array,local_150,array->a_n + -1);
                  return 0;
                }
                if (alt != 0) {
                  array_resize_and_redraw(array,local_150,array->a_n + 1);
                  pcVar15 = array->a_vec;
                  memmove(pcVar15 + iVar3,pcVar15 + lVar9,
                          (long)(int)((~uVar4 + array->a_n) * (int)local_148));
                  uVar12 = (ulong)(uVar4 + 1);
                  p_Var7 = pd_maininstance.pd_gui;
                }
                p_Var8 = p_Var7->i_template;
                iVar3 = (int)uVar12;
                if ((int)local_f8 < 0) {
                  *(undefined8 *)(p_Var8 + 0x68) = 0;
                  *(undefined4 *)(p_Var8 + 0x60) = 0;
                  *(char **)(p_Var8 + 0x90) = pcVar15;
                  *(int *)(p_Var8 + 0xa0) = array->a_n;
                  *(float *)(p_Var8 + 0xac) = (float)iVar3;
                  *(int *)(p_Var8 + 0xb8) = iVar3;
                  fVar16 = 1.0 / (t_float)local_128;
                  if (((t_float)local_128 == 0.0) && (!NAN((t_float)local_128))) {
                    fVar16 = 1.0;
                  }
                  *(float *)(p_Var8 + 0xb0) = *(float *)(p_Var8 + 0xb0) * fVar16;
                }
                else {
                  *(_fielddesc **)(p_Var8 + 0x68) = local_f0;
                  iVar5 = iVar3 * (int)local_148;
                  tVar18 = fielddesc_getcoord(local_f0,*(t_template **)(p_Var8 + 0x98),
                                              (t_word *)(pcVar15 + iVar5),1);
                  p_Var8 = (pd_maininstance.pd_gui)->i_template;
                  *(t_float *)(p_Var8 + 0x60) = tVar18;
                  *(t_word **)(p_Var8 + 0x90) = (t_word *)(pcVar15 + iVar5);
                  if (shift == 0) {
                    *(undefined4 *)(p_Var8 + 0xa0) = 1;
                  }
                  else {
                    *(int *)(p_Var8 + 0xa0) = array->a_n - iVar3;
                  }
                }
                p_Var2 = local_150;
                if (*(int *)(p_Var8 + 0xbc) == 0) {
                  if ((int)local_138._0_4_ < 0) {
                    *(undefined8 *)(p_Var8 + 0x70) = 0;
                    *(undefined4 *)(p_Var8 + 100) = 0;
                  }
                  else {
                    *(_fielddesc **)(p_Var8 + 0x70) = local_130;
                    tVar18 = fielddesc_getcoord(local_130,*(t_template **)(p_Var8 + 0x98),
                                                (t_word *)(pcVar15 + iVar3 * (int)local_148),1);
                    *(t_float *)((pd_maininstance.pd_gui)->i_template + 100) = tVar18;
                  }
                }
                else {
                  *(_fielddesc **)(p_Var8 + 0x70) = local_110;
                  tVar18 = fielddesc_getcoord(local_110,*(t_template **)(p_Var8 + 0x98),
                                              (t_word *)(pcVar15 + iVar3 * (int)local_148),1);
                  p_Var8 = (pd_maininstance.pd_gui)->i_template;
                  *(t_float *)(p_Var8 + 100) = tVar18;
                  fVar16 = *(float *)(p_Var8 + 0xb4);
                  fVar17 = -fVar16;
                  if (-fVar16 <= fVar16) {
                    fVar17 = fVar16;
                  }
                  *(float *)(p_Var8 + 0xb4) = (float)-*(int *)(p_Var8 + 0xbc) * fVar17;
                }
                glist_grab(p_Var2,(t_gobj *)0x0,array_motionfn,(t_glistkeyfn)0x0,xpix,ypix);
              }
              if (alt != 0) {
                return (uint)(local_118._0_4_ < pxpix) * 3 + 3;
              }
              return 2 - (uint)(*(int *)((pd_maininstance.pd_gui)->i_template + 0xbc) == 0);
            }
            uVar6 = (ulong)(uint)array->a_n;
            iVar3 = (int)(float)local_108 + local_120._0_4_;
            lVar9 = lVar9 + lVar14 * uVar10;
          }
        }
      }
      else if (((float)local_140 != 0.0) || (NAN((float)local_140))) {
        local_140 = 0;
        uVar10 = local_140;
        if ((local_80 != &s_float) &&
           (iVar3 = array_getfields(local_80,(_glist **)&pxpix,(t_template **)&pypix,(int *)&pwpix,
                                    local_f0,local_130,local_110,(int *)&local_a0,&yonset_1,
                                    &wonset_1), uVar10 = local_140, iVar3 == 0)) {
          local_140 = 0;
          local_108 = (t_scalar *)((ulong)(uint)array->a_n / 300);
          if (array->a_n < 2000) {
            local_108 = (t_scalar *)1;
          }
          local_d8 = (double)fVar16;
          local_120 = (double)(t_float)local_128;
          local_148 = (long)(int)pwpix;
          local_110 = (_fielddesc *)(ulong)(uint)yonset_1;
          local_118 = (t_template *)CONCAT44(uStack_e4,pypix);
          local_f8 = local_148 * (long)local_108;
          lVar9 = -(long)local_108;
          local_98 = 0.0;
          lVar13 = 0;
          lVar14 = 0;
          local_128 = (ulong)local_a0;
          do {
            lVar9 = lVar9 + (long)local_108;
            uVar10 = local_140;
            if (array->a_n <= lVar9) break;
            if ((int)local_128 < 0) {
              tVar18 = (t_float)(local_98 + local_d8);
              local_98 = local_98 + local_120;
              pcVar15 = array->a_vec;
              lVar11 = lVar14 * local_148;
            }
            else {
              pcVar15 = array->a_vec;
              tVar18 = fielddesc_cvttocoord(local_f0,*(t_float *)(pcVar15 + lVar13 + local_128));
              tVar18 = tVar18 + fVar16;
              lVar11 = lVar13;
            }
            if ((int)local_110 < 0) {
              tVar20 = 0.0;
            }
            else {
              local_138 = (_array *)CONCAT44(local_138._4_4_,tVar18);
              tVar20 = fielddesc_cvttocoord
                                 (local_130,*(t_float *)(pcVar15 + (long)local_110 + lVar11));
              tVar18 = local_138._0_4_;
            }
            lVar13 = lVar13 + local_f8;
            uVar4 = scalar_doclick((t_word *)(pcVar15 + lVar11),local_118,(t_scalar *)0x0,array,
                                   local_150,tVar18,tVar20 + fVar17,xpix,ypix,shift,alt,dbl,doit);
            lVar14 = lVar14 + (long)local_108;
            uVar10 = (ulong)uVar4;
          } while (uVar4 == 0);
        }
        local_140 = uVar10;
        return (int)local_140;
      }
    }
  }
  return 0;
}

Assistant:

static int plot_click(t_gobj *z, t_glist *glist,
    t_word *data, t_template *template, t_scalar *sc, t_array *ap,
    t_float basex, t_float basey,
    int xpix, int ypix, int shift, int alt, int dbl, int doit)
{
    t_plot *x = (t_plot *)z;
    t_symbol *elemtemplatesym;
    t_float linewidth, xloc, xinc, yloc, style, vis, scalarvis, edit;
    t_array *array;
    t_fielddesc *xfielddesc, *yfielddesc, *wfielddesc;

    if (!plot_readownertemplate(x, data, template,
        &elemtemplatesym, &array, &linewidth, &xloc, &xinc, &yloc, &style,
        &vis, &scalarvis, &edit,
        &xfielddesc, &yfielddesc, &wfielddesc) && (vis != 0))
    {
        return (array_doclick(array, glist, sc, ap, elemtemplatesym,
            basex + xloc, xinc, basey + yloc, scalarvis, edit,
            xfielddesc, yfielddesc, wfielddesc,
            xpix, ypix, shift, alt, dbl, doit));
    }
    else return (0);
}